

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::download_dir(void)

{
  Path *in_RDI;
  allocator local_51;
  string local_50 [32];
  Path local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"DOWNLOAD",&local_51);
  get_xdg_userdir_setting(&local_30,(string *)local_50);
  Path(in_RDI,&local_30.m_path);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return in_RDI;
}

Assistant:

Path Path::download_dir()
{
#if defined(_PATHIE_UNIX)
  return Path(get_xdg_userdir_setting("DOWNLOAD"));
#elif defined(_WIN32)
  // Not available via CSIDL, must use the newer KNOWNFOLDERID system,
  // which is not supported by MinGW yet.
  throw(std::runtime_error("KNOWNFOLDERID is not supported by MinGW yet, can't retrieve this directory."));
#else
#error Unsupported system.
#endif
}